

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

size_t anon_unknown.dwarf_e925f::getCacheSize(string *filename)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  primesieve_error *this;
  char lastChar;
  size_t val;
  string str;
  string *in_stack_000001d8;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  unsigned_long local_30;
  string local_28 [40];
  
  getString(in_stack_000001d8);
  local_30 = 0;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_30 = std::__cxx11::stoul(in_stack_ffffffffffffff80,(size_t *)in_stack_ffffffffffffff78,0);
    pcVar4 = (char *)std::__cxx11::string::back();
    cVar1 = *pcVar4;
    uVar5 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffc0);
    if (cVar1 == 'G') {
      local_30 = local_30 << 0x1e;
    }
    else if (cVar1 == 'K') {
      local_30 = local_30 << 10;
    }
    else if (cVar1 == 'M') {
      local_30 = local_30 << 0x14;
    }
    else {
      iVar2 = isdigit((int)cVar1);
      if (iVar2 == 0) {
        this = (primesieve_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_ffffffffffffffc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffc4,uVar5));
        primesieve::primesieve_error::primesieve_error(this,in_stack_ffffffffffffff78);
        __cxa_throw(this,&primesieve::primesieve_error::typeinfo,
                    primesieve::primesieve_error::~primesieve_error);
      }
    }
  }
  std::__cxx11::string::~string(local_28);
  return local_30;
}

Assistant:

size_t getCacheSize(const string& filename)
{
  string str = getString(filename);
  size_t val = 0;

  if (!str.empty())
  {
    val = stoul(str);
    char lastChar = str.back();

    // The last character may be:
    // 'K' = KiB (kibibyte)
    // 'M' = MiB (mebibyte)
    // 'G' = GiB (gibibyte)
    switch (lastChar)
    {
      case 'K': val *= 1 << 10; break;
      case 'M': val *= 1 << 20; break;
      case 'G': val *= 1 << 30; break;
      default:
        if (!isdigit(lastChar))
          throw primesieve_error("invalid cache size: " + str);
    }
  }

  return val;
}